

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

Bone * __thiscall Assimp::Ogre::Skeleton::BoneByName(Skeleton *this,string *name)

{
  bool bVar1;
  __type _Var2;
  reference ppBVar3;
  __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
  local_30;
  __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
  local_28;
  const_iterator iter;
  string *name_local;
  Skeleton *this_local;
  
  iter._M_current = (Bone **)name;
  local_28._M_current =
       (Bone **)std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::begin
                          (&this->bones);
  while( true ) {
    local_30._M_current =
         (Bone **)std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::end
                            (&this->bones);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return (Bone *)0x0;
    }
    ppBVar3 = __gnu_cxx::
              __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
              ::operator*(&local_28);
    _Var2 = std::operator==(&(*ppBVar3)->name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            iter._M_current);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
    ::operator++(&local_28);
  }
  ppBVar3 = __gnu_cxx::
            __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
            ::operator*(&local_28);
  return *ppBVar3;
}

Assistant:

Bone *Skeleton::BoneByName(const std::string &name) const
{
    for(BoneList::const_iterator iter = bones.begin(); iter != bones.end(); ++iter)
    {
        if ((*iter)->name == name)
            return (*iter);
    }
    return 0;
}